

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_descending_eig_twod(REF_DBL *d)

{
  REF_DBL RVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  pdVar4 = d + 5;
  uVar3 = 0xffffffff;
  dVar8 = -2.0;
  uVar7 = 0;
  do {
    dVar9 = pdVar4[-2] * 0.0 + pdVar4[-1] * 0.0 + *pdVar4;
    if (dVar9 <= -dVar9) {
      dVar9 = -dVar9;
    }
    if (dVar8 < dVar9) {
      uVar3 = uVar7 & 0xffffffff;
      dVar8 = dVar9;
    }
    uVar7 = uVar7 + 1;
    pdVar4 = pdVar4 + 3;
  } while (uVar7 != 3);
  iVar2 = (int)uVar3;
  if (iVar2 != 2) {
    if (iVar2 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x175,"ref_matrix_descending_eig_twod","better dot not found, no z preference");
      return 1;
    }
    RVar1 = d[2];
    d[2] = d[iVar2];
    d[iVar2] = RVar1;
    lVar5 = 0;
    do {
      RVar1 = d[lVar5 + 9];
      iVar6 = iVar2 * 3 + 3 + (int)lVar5;
      d[lVar5 + 9] = d[iVar6];
      d[iVar6] = RVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  dVar8 = *d;
  if (dVar8 < d[1]) {
    *d = d[1];
    d[1] = dVar8;
    lVar5 = -3;
    do {
      RVar1 = d[lVar5 + 6];
      d[lVar5 + 6] = d[lVar5 + 9];
      d[lVar5 + 9] = RVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_descending_eig_twod(REF_DBL *d) {
  REF_DBL temp;
  REF_INT i, zdir;
  REF_DBL dot, best_dot;
  REF_DBL znorm[] = {0, 0, 1};

  best_dot = -2.0;
  zdir = REF_EMPTY;
  for (i = 0; i < 3; i++) {
    dot = ABS(ref_math_dot(znorm, ref_matrix_vec_ptr(d, i)));
    if (dot > best_dot) {
      best_dot = dot;
      zdir = i;
    }
  }
  RUS(REF_EMPTY, zdir, "better dot not found, no z preference");

  if (2 != zdir) {
    temp = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = ref_matrix_eig(d, zdir);
    ref_matrix_eig(d, zdir) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = ref_matrix_vec(d, i, zdir);
      ref_matrix_vec(d, i, zdir) = temp;
    }
  }

  if (ref_matrix_eig(d, 1) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = temp;
    }
  }

  return REF_SUCCESS;
}